

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qboxlayout.cpp
# Opt level: O0

void __thiscall QBoxLayout::insertSpacerItem(QBoxLayout *this,int index,QSpacerItem *spacerItem)

{
  QBoxLayoutItem *this_00;
  QLayoutItem *in_RDX;
  undefined4 in_ESI;
  QList<QBoxLayoutItem_*> *in_RDI;
  QBoxLayoutItem *it;
  QBoxLayoutPrivate *d;
  undefined4 in_stack_fffffffffffffff0;
  
  d_func((QBoxLayout *)0x2f5555);
  QBoxLayoutPrivate::validateIndex
            ((QBoxLayoutPrivate *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
             (int)((ulong)in_RDX >> 0x20));
  this_00 = (QBoxLayoutItem *)operator_new(0x10);
  QBoxLayoutItem::QBoxLayoutItem(this_00,in_RDX,0);
  this_00->magic = true;
  QList<QBoxLayoutItem_*>::insert(in_RDI,(qsizetype)this_00,this_00);
  (**(code **)&(in_RDI->d).d[7].super_QArrayData)();
  return;
}

Assistant:

void QBoxLayout::insertSpacerItem(int index, QSpacerItem *spacerItem)
{
    Q_D(QBoxLayout);
    index = d->validateIndex(index);
    QBoxLayoutItem *it = new QBoxLayoutItem(spacerItem);
    it->magic = true;
    d->list.insert(index, it);
    invalidate();
}